

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QPDFJob.cc
# Opt level: O1

void __thiscall QPDFJob::setWriterOptions(QPDFJob *this,QPDFWriter *w)

{
  int level;
  element_type *peVar1;
  element_type *peVar2;
  pointer pcVar3;
  FunctionProgressReporter *this_00;
  element_type *peVar4;
  char *__s;
  int extension_level;
  unique_ptr<QPDF,_std::default_delete<QPDF>_> encryption_pdf;
  int local_94;
  string local_90;
  shared_ptr<QPDFWriter::ProgressReporter> local_70;
  shared_ptr<QPDFWriter::ProgressReporter> local_60;
  _Any_data local_50;
  code *local_40;
  
  level = ((this->m).super___shared_ptr<QPDFJob::Members,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
          compression_level;
  if (-1 < level) {
    Pl_Flate::setCompressionLevel(level);
  }
  if (((this->m).super___shared_ptr<QPDFJob::Members,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->qdf_mode
      == true) {
    QPDFWriter::setQDFMode(w,true);
  }
  if (((this->m).super___shared_ptr<QPDFJob::Members,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
      preserve_unreferenced_objects == true) {
    QPDFWriter::setPreserveUnreferencedObjects(w,true);
  }
  if (((this->m).super___shared_ptr<QPDFJob::Members,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
      newline_before_endstream == true) {
    QPDFWriter::setNewlineBeforeEndstream(w,true);
  }
  peVar1 = (this->m).super___shared_ptr<QPDFJob::Members,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  if (peVar1->normalize_set == true) {
    QPDFWriter::setContentNormalization(w,peVar1->normalize);
  }
  peVar1 = (this->m).super___shared_ptr<QPDFJob::Members,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  if (peVar1->stream_data_set == true) {
    QPDFWriter::setStreamDataMode(w,peVar1->stream_data_mode);
  }
  peVar1 = (this->m).super___shared_ptr<QPDFJob::Members,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  if (peVar1->compress_streams_set == true) {
    QPDFWriter::setCompressStreams(w,peVar1->compress_streams);
  }
  peVar1 = (this->m).super___shared_ptr<QPDFJob::Members,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  if (peVar1->recompress_flate_set == true) {
    QPDFWriter::setRecompressFlate(w,peVar1->recompress_flate);
  }
  peVar1 = (this->m).super___shared_ptr<QPDFJob::Members,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  if (peVar1->decode_level_set == true) {
    QPDFWriter::setDecodeLevel(w,peVar1->decode_level);
  }
  if (((this->m).super___shared_ptr<QPDFJob::Members,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->decrypt
      == true) {
    QPDFWriter::setPreserveEncryption(w,false);
  }
  if (((this->m).super___shared_ptr<QPDFJob::Members,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
      deterministic_id == true) {
    QPDFWriter::setDeterministicID(w,true);
  }
  if (((this->m).super___shared_ptr<QPDFJob::Members,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->static_id
      == true) {
    QPDFWriter::setStaticID(w,true);
  }
  if (((this->m).super___shared_ptr<QPDFJob::Members,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
      static_aes_iv == true) {
    QPDFWriter::setStaticAesIV(w,true);
  }
  if (((this->m).super___shared_ptr<QPDFJob::Members,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
      suppress_original_object_id == true) {
    QPDFWriter::setSuppressOriginalObjectIDs(w,true);
  }
  peVar1 = (this->m).super___shared_ptr<QPDFJob::Members,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  if (peVar1->copy_encryption == true) {
    local_90._M_dataplus._M_p = (pointer)0x0;
    processFile(this,(unique_ptr<QPDF,_std::default_delete<QPDF>_> *)&local_90,
                (peVar1->encryption_file)._M_dataplus._M_p,
                (peVar1->encryption_file_password).
                super___shared_ptr<char,_(__gnu_cxx::_Lock_policy)2>._M_ptr,false,false);
    QPDFWriter::copyEncryptionParameters(w,(QPDF *)local_90._M_dataplus._M_p);
    std::unique_ptr<QPDF,_std::default_delete<QPDF>_>::~unique_ptr
              ((unique_ptr<QPDF,_std::default_delete<QPDF>_> *)&local_90);
  }
  if (((this->m).super___shared_ptr<QPDFJob::Members,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->encrypt
      == true) {
    setEncryptionOptions(this,w);
  }
  if (((this->m).super___shared_ptr<QPDFJob::Members,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->linearize
      == true) {
    QPDFWriter::setLinearization(w,true);
  }
  peVar1 = (this->m).super___shared_ptr<QPDFJob::Members,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  if ((peVar1->linearize_pass1)._M_string_length != 0) {
    QPDFWriter::setLinearizationPass1Filename(w,&peVar1->linearize_pass1);
  }
  peVar1 = (this->m).super___shared_ptr<QPDFJob::Members,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  if (peVar1->object_stream_set == true) {
    QPDFWriter::setObjectStreamMode(w,peVar1->object_stream_mode);
  }
  QPDFWriter::setMinimumPDFVersion
            (w,&((this->m).super___shared_ptr<QPDFJob::Members,_(__gnu_cxx::_Lock_policy)2>._M_ptr)
                ->max_input_version);
  peVar1 = (this->m).super___shared_ptr<QPDFJob::Members,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  if ((peVar1->min_version)._M_string_length != 0) {
    local_90._M_string_length = 0;
    local_90.field_2._M_local_buf[0] = '\0';
    local_94 = 0;
    local_90._M_dataplus._M_p = (pointer)&local_90.field_2;
    parse_version(&peVar1->min_version,&local_90,&local_94);
    QPDFWriter::setMinimumPDFVersion(w,&local_90,local_94);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_90._M_dataplus._M_p != &local_90.field_2) {
      operator_delete(local_90._M_dataplus._M_p,
                      CONCAT71(local_90.field_2._M_allocated_capacity._1_7_,
                               local_90.field_2._M_local_buf[0]) + 1);
    }
  }
  peVar1 = (this->m).super___shared_ptr<QPDFJob::Members,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  if ((peVar1->force_version)._M_string_length != 0) {
    local_90._M_string_length = 0;
    local_90.field_2._M_local_buf[0] = '\0';
    local_94 = 0;
    local_90._M_dataplus._M_p = (pointer)&local_90.field_2;
    parse_version(&peVar1->force_version,&local_90,&local_94);
    QPDFWriter::forcePDFVersion(w,&local_90,local_94);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_90._M_dataplus._M_p != &local_90.field_2) {
      operator_delete(local_90._M_dataplus._M_p,
                      CONCAT71(local_90.field_2._M_allocated_capacity._1_7_,
                               local_90.field_2._M_local_buf[0]) + 1);
    }
  }
  peVar1 = (this->m).super___shared_ptr<QPDFJob::Members,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  if (peVar1->progress == true) {
    if ((peVar1->progress_handler).super__Function_base._M_manager == (_Manager_type)0x0) {
      peVar2 = (peVar1->outfilename).super___shared_ptr<char,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
      __s = "standard output";
      if (peVar2 != (element_type *)0x0) {
        __s = peVar2;
      }
      peVar4 = (element_type *)operator_new(0x50);
      QPDFLogger::getInfo((QPDFLogger *)&local_90,
                          SUB81((peVar1->log).
                                super___shared_ptr<QPDFLogger,_(__gnu_cxx::_Lock_policy)2>._M_ptr,0)
                         );
      peVar1 = (this->m).super___shared_ptr<QPDFJob::Members,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
      peVar4->_vptr_ProgressReporter = (_func_int **)&PTR__ProgressReporter_002ef8f8;
      peVar4[1]._vptr_ProgressReporter = (_func_int **)local_90._M_dataplus._M_p;
      peVar4[2]._vptr_ProgressReporter = (_func_int **)(peVar4 + 4);
      pcVar3 = (peVar1->message_prefix)._M_dataplus._M_p;
      std::__cxx11::string::_M_construct<char*>
                ((string *)(peVar4 + 2),pcVar3,pcVar3 + (peVar1->message_prefix)._M_string_length);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)(peVar4 + 6),__s,(allocator<char> *)&local_94);
      local_70.super___shared_ptr<QPDFWriter::ProgressReporter,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
      local_70.super___shared_ptr<QPDFWriter::ProgressReporter,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
           peVar4;
      local_70.super___shared_ptr<QPDFWriter::ProgressReporter,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)operator_new(0x18);
      (local_70.super___shared_ptr<QPDFWriter::ProgressReporter,_(__gnu_cxx::_Lock_policy)2>.
       _M_refcount._M_pi)->_M_use_count = 1;
      (local_70.super___shared_ptr<QPDFWriter::ProgressReporter,_(__gnu_cxx::_Lock_policy)2>.
       _M_refcount._M_pi)->_M_weak_count = 1;
      (local_70.super___shared_ptr<QPDFWriter::ProgressReporter,_(__gnu_cxx::_Lock_policy)2>.
       _M_refcount._M_pi)->_vptr__Sp_counted_base = (_func_int **)&PTR___Sp_counted_base_002efba0;
      local_70.super___shared_ptr<QPDFWriter::ProgressReporter,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi[1]._vptr__Sp_counted_base = (_func_int **)peVar4;
      QPDFWriter::registerProgressReporter(w,&local_70);
      if (local_70.super___shared_ptr<QPDFWriter::ProgressReporter,_(__gnu_cxx::_Lock_policy)2>.
          _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  (local_70.
                   super___shared_ptr<QPDFWriter::ProgressReporter,_(__gnu_cxx::_Lock_policy)2>.
                   _M_refcount._M_pi);
      }
      if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_90._M_string_length !=
          (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_90._M_string_length);
      }
    }
    else {
      this_00 = (FunctionProgressReporter *)operator_new(0x28);
      std::function<void_(int)>::function
                ((function<void_(int)> *)&local_50,&peVar1->progress_handler);
      QPDFWriter::FunctionProgressReporter::FunctionProgressReporter
                (this_00,(function<void_(int)> *)&local_50);
      local_60.super___shared_ptr<QPDFWriter::ProgressReporter,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
           (element_type *)this_00;
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
      __shared_count<QPDFWriter::FunctionProgressReporter*>
                (&local_60.
                  super___shared_ptr<QPDFWriter::ProgressReporter,_(__gnu_cxx::_Lock_policy)2>.
                  _M_refcount,this_00);
      QPDFWriter::registerProgressReporter(w,&local_60);
      if (local_60.super___shared_ptr<QPDFWriter::ProgressReporter,_(__gnu_cxx::_Lock_policy)2>.
          _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  (local_60.
                   super___shared_ptr<QPDFWriter::ProgressReporter,_(__gnu_cxx::_Lock_policy)2>.
                   _M_refcount._M_pi);
      }
      if (local_40 != (code *)0x0) {
        (*local_40)(&local_50,&local_50,__destroy_functor);
      }
    }
  }
  return;
}

Assistant:

void
QPDFJob::setWriterOptions(QPDFWriter& w)
{
    if (m->compression_level >= 0) {
        Pl_Flate::setCompressionLevel(m->compression_level);
    }
    if (m->qdf_mode) {
        w.setQDFMode(true);
    }
    if (m->preserve_unreferenced_objects) {
        w.setPreserveUnreferencedObjects(true);
    }
    if (m->newline_before_endstream) {
        w.setNewlineBeforeEndstream(true);
    }
    if (m->normalize_set) {
        w.setContentNormalization(m->normalize);
    }
    if (m->stream_data_set) {
        w.setStreamDataMode(m->stream_data_mode);
    }
    if (m->compress_streams_set) {
        w.setCompressStreams(m->compress_streams);
    }
    if (m->recompress_flate_set) {
        w.setRecompressFlate(m->recompress_flate);
    }
    if (m->decode_level_set) {
        w.setDecodeLevel(m->decode_level);
    }
    if (m->decrypt) {
        w.setPreserveEncryption(false);
    }
    if (m->deterministic_id) {
        w.setDeterministicID(true);
    }
    if (m->static_id) {
        w.setStaticID(true);
    }
    if (m->static_aes_iv) {
        w.setStaticAesIV(true);
    }
    if (m->suppress_original_object_id) {
        w.setSuppressOriginalObjectIDs(true);
    }
    if (m->copy_encryption) {
        std::unique_ptr<QPDF> encryption_pdf;
        processFile(
            encryption_pdf,
            m->encryption_file.c_str(),
            m->encryption_file_password.get(),
            false,
            false);
        w.copyEncryptionParameters(*encryption_pdf);
    }
    if (m->encrypt) {
        setEncryptionOptions(w);
    }
    if (m->linearize) {
        w.setLinearization(true);
    }
    if (!m->linearize_pass1.empty()) {
        w.setLinearizationPass1Filename(m->linearize_pass1);
    }
    if (m->object_stream_set) {
        w.setObjectStreamMode(m->object_stream_mode);
    }
    w.setMinimumPDFVersion(m->max_input_version);
    if (!m->min_version.empty()) {
        std::string version;
        int extension_level = 0;
        parse_version(m->min_version, version, extension_level);
        w.setMinimumPDFVersion(version, extension_level);
    }
    if (!m->force_version.empty()) {
        std::string version;
        int extension_level = 0;
        parse_version(m->force_version, version, extension_level);
        w.forcePDFVersion(version, extension_level);
    }
    if (m->progress) {
        if (m->progress_handler) {
            w.registerProgressReporter(
                std::shared_ptr<QPDFWriter::ProgressReporter>(
                    new QPDFWriter::FunctionProgressReporter(m->progress_handler)));
        } else {
            char const* outfilename = m->outfilename ? m->outfilename.get() : "standard output";
            w.registerProgressReporter(
                std::shared_ptr<QPDFWriter::ProgressReporter>(
                    // line-break
                    new ProgressReporter(*m->log->getInfo(), m->message_prefix, outfilename)));
        }
    }
}